

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  parasail_result_t *ppVar8;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar9;
  int32_t *ptr_02;
  long lVar10;
  int32_t *piVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  char *__format;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar38;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar51 [16];
  int iVar56;
  undefined1 in_XMM13 [16];
  undefined1 auVar55 [16];
  int iVar57;
  undefined1 local_168 [16];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  undefined1 local_128 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 local_48 [16];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "_s2";
  }
  else {
    uVar13 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar14 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar14 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar14 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar14 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_0061d547:
        uVar26 = s2Len + 3;
        iVar22 = -open;
        iVar23 = matrix->min;
        uVar25 = 0x80000000 - iVar23;
        if (iVar23 != iVar22 && SBORROW4(iVar23,iVar22) == iVar23 + open < 0) {
          uVar25 = open | 0x80000000;
        }
        iVar23 = uVar25 + 1;
        uVar25 = 0x7ffffffe - matrix->max;
        local_128 = (undefined1  [16])0x0;
        if (s1_beg == 0) {
          local_a8 = gap << 2;
          iStack_a4 = gap << 2;
          iStack_a0 = gap << 2;
          iStack_9c = gap << 2;
        }
        else {
          local_a8 = 0;
          iStack_a4 = 0;
          iStack_a0 = 0;
          iStack_9c = 0;
        }
        local_c8._0_8_ = CONCAT44(iVar23,iVar23);
        local_c8._8_8_ = CONCAT44(iVar23,iVar23);
        local_d8._8_8_ = local_c8._8_8_;
        local_d8._0_8_ = local_c8._0_8_;
        local_98._8_8_ = local_c8._8_8_;
        local_98._0_8_ = local_c8._0_8_;
        local_e8._8_8_ = local_c8._8_8_;
        local_e8._0_8_ = local_c8._0_8_;
        if (s1_beg == 0) {
          local_128._4_4_ = iVar22 + gap * -2;
          local_128._0_4_ = gap * -3 - open;
          local_128._12_4_ = iVar22;
          local_128._8_4_ = iVar22 - gap;
        }
        local_58 = gap;
        iStack_54 = gap;
        iStack_50 = gap;
        iStack_4c = gap;
        ppVar8 = parasail_result_new();
        if (ppVar8 != (parasail_result_t *)0x0) {
          ppVar8->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                         (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar8->flag |
                         0x4401002;
          uVar16 = (ulong)(s2Len + 6);
          ptr = parasail_memalign_int32_t(0x10,uVar16);
          ptr_00 = parasail_memalign_int32_t(0x10,uVar16);
          ptr_01 = parasail_memalign_int32_t(0x10,uVar16);
          if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
            lVar9 = (long)_s1Len;
            if (matrix->type == 0) {
              ptr_02 = parasail_memalign_int32_t(0x10,(long)(int)(_s1Len + 3));
              uVar16 = 0;
              if (ptr_02 == (int32_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar12 = 0;
              if (0 < _s1Len) {
                uVar12 = (ulong)(uint)_s1Len;
              }
              for (; lVar10 = lVar9, uVar12 != uVar16; uVar16 = uVar16 + 1) {
                ptr_02[uVar16] = matrix->mapper[(byte)_s1[uVar16]];
              }
              for (; lVar10 < (int)(_s1Len + 3); lVar10 = lVar10 + 1) {
                ptr_02[lVar10] = 0;
              }
            }
            else {
              ptr_02 = (int32_t *)0x0;
            }
            local_b8 = uVar25;
            uStack_b4 = uVar25;
            uStack_b0 = uVar25;
            uStack_ac = uVar25;
            local_68 = open;
            iStack_64 = open;
            iStack_60 = open;
            iStack_5c = open;
            local_78._0_4_ = _s1Len - 1;
            local_78._4_4_ = _s1Len - 1;
            local_78._8_4_ = _s1Len - 1;
            local_78._12_4_ = _s1Len - 1;
            piVar2 = matrix->mapper;
            for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
              ptr[uVar16 + 3] = piVar2[(byte)_s2[uVar16]];
            }
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              ptr[lVar10] = 0;
            }
            piVar11 = ptr + uVar13 + 3;
            for (uVar16 = uVar13; (int)uVar16 < (int)uVar26; uVar16 = (ulong)((int)uVar16 + 1)) {
              *piVar11 = 0;
              piVar11 = piVar11 + 1;
            }
            uVar16 = 0;
            iVar24 = iVar22;
            if (s2_beg == 0) {
              for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
                ptr_00[uVar16 + 3] = iVar24;
                ptr_01[uVar16 + 3] = iVar23;
                iVar24 = iVar24 - gap;
              }
            }
            else {
              for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
                ptr_00[uVar16 + 3] = 0;
                ptr_01[uVar16 + 3] = iVar23;
              }
            }
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              ptr_00[lVar10] = iVar23;
              ptr_01[lVar10] = iVar23;
            }
            for (; (int)uVar13 < (int)uVar26; uVar13 = uVar13 + 1) {
              ptr_00[uVar13 + 3] = iVar23;
              ptr_01[uVar13 + 3] = iVar23;
            }
            ptr_00[2] = 0;
            uVar18 = _s1Len - 1;
            auVar4._4_4_ = iVar23;
            auVar4._0_4_ = iVar23;
            auVar4._8_4_ = iVar23;
            local_98._12_4_ = iVar23;
            local_98._0_12_ = auVar4;
            local_88 = local_98 >> 0x20;
            auVar6 = local_88;
            if ((int)uVar26 < 1) {
              uVar26 = 0;
            }
            auVar55 = pmovsxbd(in_XMM13,0x10203);
            uVar13 = 0;
            auVar44 = local_78;
            auVar30 = local_98;
            auVar35 = local_98;
            local_e8 = local_98;
            local_48 = local_98;
            local_168 = local_98;
            local_158 = uVar25;
            uStack_154 = uVar25;
            uStack_150 = uVar25;
            uStack_14c = uVar25;
            while ((long)uVar13 < lVar9) {
              uVar38 = (uint)uVar13;
              if (matrix->type == 0) {
                uVar15 = ptr_02[uVar13 + 1];
                uVar19 = ptr_02[uVar13 + 2];
                uVar17 = ptr_02[uVar13];
                uVar21 = ptr_02[uVar13 | 3];
              }
              else {
                uVar15 = uVar38 | 1;
                if (lVar9 <= (long)(uVar13 | 1)) {
                  uVar15 = uVar18;
                }
                uVar19 = uVar38 | 2;
                if (lVar9 <= (long)(uVar13 | 2)) {
                  uVar19 = uVar18;
                }
                uVar17 = uVar38;
                uVar21 = uVar38 | 3;
                if (lVar9 <= (long)(uVar13 | 3)) {
                  uVar21 = uVar18;
                }
              }
              piVar2 = matrix->matrix;
              iVar24 = matrix->size;
              local_88._0_8_ = auVar4._4_8_;
              auVar36._12_4_ = ptr_00[2];
              auVar36._8_4_ = iVar23;
              auVar36._0_8_ = local_88._0_8_;
              iVar7 = iVar22 - uVar38 * gap;
              if (s1_beg != 0) {
                iVar7 = 0;
              }
              auVar45._12_4_ = iVar7;
              auVar45._8_4_ = iVar23;
              auVar45._0_8_ = local_88._0_8_;
              uVar13 = uVar13 + 4;
              ptr_00[2] = iVar22 - (int)uVar13 * gap;
              iVar7 = auVar55._0_4_;
              auVar47._0_4_ = -(uint)(local_78._0_4_ == iVar7);
              iVar56 = auVar55._4_4_;
              auVar47._4_4_ = -(uint)(local_78._4_4_ == iVar56);
              iVar20 = auVar55._8_4_;
              auVar47._8_4_ = -(uint)(local_78._8_4_ == iVar20);
              iVar57 = auVar55._12_4_;
              auVar47._12_4_ = -(uint)(local_78._12_4_ == iVar57);
              uVar16 = 0;
              auVar49._4_4_ = iVar23;
              auVar49._0_4_ = iVar23;
              auVar49._8_4_ = iVar23;
              auVar49._12_4_ = iVar23;
              auVar44 = pmovsxbd(auVar44,0xfffefd);
              auVar51 = auVar49;
              for (; uVar26 != uVar16; uVar16 = uVar16 + 1) {
                iVar1 = ptr_00[uVar16 + 3];
                iVar27 = auVar45._4_4_ - open;
                iVar31 = auVar45._8_4_ - open;
                iVar32 = auVar45._12_4_ - open;
                iVar33 = iVar1 - open;
                iVar50 = auVar51._4_4_ - local_58;
                iVar52 = auVar51._8_4_ - iStack_54;
                iVar53 = auVar51._12_4_ - iStack_50;
                iVar54 = ptr_01[uVar16 + 3] - iStack_4c;
                auVar51._0_4_ = (uint)(iVar50 < iVar27) * iVar27 | (uint)(iVar50 >= iVar27) * iVar50
                ;
                auVar51._4_4_ = (uint)(iVar52 < iVar31) * iVar31 | (uint)(iVar52 >= iVar31) * iVar52
                ;
                auVar51._8_4_ = (uint)(iVar53 < iVar32) * iVar32 | (uint)(iVar53 >= iVar32) * iVar53
                ;
                auVar51._12_4_ =
                     (uint)(iVar54 < iVar33) * iVar33 | (uint)(iVar54 >= iVar33) * iVar54;
                iVar27 = auVar45._0_4_ - open;
                iVar31 = auVar45._4_4_ - open;
                iVar32 = auVar45._8_4_ - open;
                iVar33 = auVar45._12_4_ - open;
                iVar50 = auVar49._0_4_ - local_58;
                iVar52 = auVar49._4_4_ - iStack_54;
                iVar53 = auVar49._8_4_ - iStack_50;
                iVar54 = auVar49._12_4_ - iStack_4c;
                auVar48._0_4_ = (uint)(iVar50 < iVar27) * iVar27 | (uint)(iVar50 >= iVar27) * iVar50
                ;
                auVar48._4_4_ = (uint)(iVar52 < iVar31) * iVar31 | (uint)(iVar52 >= iVar31) * iVar52
                ;
                auVar48._8_4_ = (uint)(iVar53 < iVar32) * iVar32 | (uint)(iVar53 >= iVar32) * iVar53
                ;
                auVar48._12_4_ =
                     (uint)(iVar54 < iVar33) * iVar33 | (uint)(iVar54 >= iVar33) * iVar54;
                iVar27 = piVar2[(long)(int)(uVar21 * iVar24) + (long)ptr[uVar16]] + auVar36._0_4_;
                iVar31 = piVar2[(long)(int)(uVar19 * iVar24) + (long)ptr[uVar16 + 1]] +
                         auVar36._4_4_;
                iVar32 = piVar2[(long)(int)(uVar15 * iVar24) + (long)ptr[uVar16 + 2]] +
                         auVar36._8_4_;
                iVar33 = piVar2[(long)(int)(uVar17 * iVar24) + (long)ptr[uVar16 + 3]] +
                         auVar36._12_4_;
                uVar38 = ((int)auVar48._0_4_ < (int)auVar51._0_4_) * auVar51._0_4_ |
                         ((int)auVar48._0_4_ >= (int)auVar51._0_4_) * auVar48._0_4_;
                uVar41 = ((int)auVar48._4_4_ < (int)auVar51._4_4_) * auVar51._4_4_ |
                         ((int)auVar48._4_4_ >= (int)auVar51._4_4_) * auVar48._4_4_;
                uVar42 = ((int)auVar48._8_4_ < (int)auVar51._8_4_) * auVar51._8_4_ |
                         ((int)auVar48._8_4_ >= (int)auVar51._8_4_) * auVar48._8_4_;
                uVar43 = ((int)auVar48._12_4_ < (int)auVar51._12_4_) * auVar51._12_4_ |
                         ((int)auVar48._12_4_ >= (int)auVar51._12_4_) * auVar48._12_4_;
                auVar39._0_4_ =
                     (uint)((int)uVar38 < iVar27) * iVar27 | ((int)uVar38 >= iVar27) * uVar38;
                auVar39._4_4_ =
                     (uint)((int)uVar41 < iVar31) * iVar31 | ((int)uVar41 >= iVar31) * uVar41;
                auVar39._8_4_ =
                     (uint)((int)uVar42 < iVar32) * iVar32 | ((int)uVar42 >= iVar32) * uVar42;
                auVar39._12_4_ =
                     (uint)((int)uVar43 < iVar33) * iVar33 | ((int)uVar43 >= iVar33) * uVar43;
                iVar50 = auVar44._0_4_;
                auVar28._0_4_ = -(uint)(iVar50 == -1);
                iVar52 = auVar44._4_4_;
                auVar28._4_4_ = -(uint)(iVar52 == -1);
                iVar53 = auVar44._8_4_;
                iVar54 = auVar44._12_4_;
                auVar28._8_4_ = -(uint)(iVar53 == -1);
                auVar28._12_4_ = -(uint)(iVar54 == -1);
                auVar46 = blendvps(auVar39,local_128,auVar28);
                auVar5._4_4_ = iVar23;
                auVar5._0_4_ = iVar23;
                auVar5._8_4_ = iVar23;
                auVar5._12_4_ = iVar23;
                auVar51 = blendvps(auVar51,auVar5,auVar28);
                auVar49 = blendvps(auVar48,auVar5,auVar28);
                iVar33 = auVar46._0_4_;
                iVar27 = auVar46._4_4_;
                iVar32 = auVar46._12_4_;
                iVar31 = auVar46._8_4_;
                if (3 < uVar16) {
                  local_158 = (uint)(iVar33 < (int)local_158) * iVar33 |
                              (iVar33 >= (int)local_158) * local_158;
                  uStack_154 = (uint)(iVar27 < (int)uStack_154) * iVar27 |
                               (iVar27 >= (int)uStack_154) * uStack_154;
                  uStack_150 = (uint)(iVar31 < (int)uStack_150) * iVar31 |
                               (iVar31 >= (int)uStack_150) * uStack_150;
                  uStack_14c = (uint)(iVar32 < (int)uStack_14c) * iVar32 |
                               (iVar32 >= (int)uStack_14c) * uStack_14c;
                  local_168._4_4_ =
                       (uint)((int)local_168._4_4_ < iVar27) * iVar27 |
                       (uint)((int)local_168._4_4_ >= iVar27) * local_168._4_4_;
                  local_168._0_4_ =
                       (uint)((int)local_168._0_4_ < iVar33) * iVar33 |
                       (uint)((int)local_168._0_4_ >= iVar33) * local_168._0_4_;
                  local_168._8_4_ =
                       (uint)((int)local_168._8_4_ < iVar31) * iVar31 |
                       (uint)((int)local_168._8_4_ >= iVar31) * local_168._8_4_;
                  local_168._12_4_ =
                       (uint)((int)local_168._12_4_ < iVar32) * iVar32 |
                       (uint)((int)local_168._12_4_ >= iVar32) * local_168._12_4_;
                }
                auVar34._0_4_ = -(uint)(iVar7 < _s1Len);
                auVar34._4_4_ = -(uint)(iVar56 < _s1Len);
                auVar34._8_4_ = -(uint)(iVar20 < _s1Len);
                auVar34._12_4_ = -(uint)(iVar57 < _s1Len);
                auVar29._0_4_ = -(uint)(iVar50 < s2Len);
                auVar29._4_4_ = -(uint)(iVar52 < s2Len);
                auVar29._8_4_ = -(uint)(iVar53 < s2Len);
                auVar29._12_4_ = -(uint)(iVar54 < s2Len);
                auVar37._0_4_ = -(uint)(auVar35._0_4_ < iVar33);
                auVar37._4_4_ = -(uint)(auVar35._4_4_ < iVar27);
                auVar37._8_4_ = -(uint)(auVar35._8_4_ < iVar31);
                auVar37._12_4_ = -(uint)(auVar35._12_4_ < iVar32);
                auVar37 = ~auVar44 & auVar29 & auVar47 & auVar37;
                local_c8 = blendvps(auVar35,auVar39,auVar37);
                auVar40._0_4_ = -(uint)(s2Len + -1 == iVar50);
                auVar40._4_4_ = -(uint)(s2Len + -1 == iVar52);
                auVar40._8_4_ = -(uint)(s2Len + -1 == iVar53);
                auVar40._12_4_ = -(uint)(s2Len + -1 == iVar54);
                auVar35._0_4_ = -(uint)(auVar30._0_4_ < iVar33);
                auVar35._4_4_ = -(uint)(auVar30._4_4_ < iVar27);
                auVar35._8_4_ = -(uint)(auVar30._8_4_ < iVar31);
                auVar35._12_4_ = -(uint)(auVar30._12_4_ < iVar32);
                auVar35 = auVar34 & auVar40 & auVar35;
                local_d8 = blendvps(auVar30,auVar46,auVar35);
                local_98 = blendvps(local_98,auVar46,auVar40 & auVar47);
                ptr_00[uVar16] = iVar33;
                ptr_01[uVar16] = auVar51._0_4_;
                local_e8 = blendvps(local_e8,auVar55,auVar35);
                local_48 = blendvps(local_48,auVar44,auVar37);
                auVar44._0_4_ = iVar50 + 1;
                auVar44._4_4_ = iVar52 + 1;
                auVar44._8_4_ = iVar53 + 1;
                auVar44._12_4_ = iVar54 + 1;
                auVar36._12_4_ = iVar1;
                auVar36._0_12_ = auVar45._4_12_;
                auVar45 = auVar46;
                auVar30 = local_d8;
                auVar35 = local_c8;
              }
              auVar55._0_4_ = iVar7 + 4;
              auVar55._4_4_ = iVar56 + 4;
              auVar55._8_4_ = iVar20 + 4;
              auVar55._12_4_ = iVar57 + 4;
              local_128._4_4_ = local_128._4_4_ - iStack_a4;
              local_128._0_4_ = local_128._0_4_ - local_a8;
              local_128._8_4_ = local_128._8_4_ - iStack_a0;
              local_128._12_4_ = local_128._12_4_ - iStack_9c;
            }
            iVar22 = 0;
            uVar38 = 0;
            uVar26 = 0;
            iVar24 = iVar23;
            iVar7 = iVar23;
            iVar56 = iVar23;
            for (lVar9 = 0; (int)lVar9 != 4; lVar9 = lVar9 + 1) {
              iVar20 = *(int *)(local_d8 + lVar9 * 4);
              if (iVar7 < iVar20) {
                iVar7 = iVar20;
                uVar26 = *(uint *)(local_e8 + lVar9 * 4);
                uVar38 = *(uint *)(local_e8 + lVar9 * 4);
              }
              else if ((iVar20 == iVar7) &&
                      (uVar15 = *(uint *)(local_e8 + lVar9 * 4), bVar3 = (int)uVar15 < (int)uVar26,
                      uVar26 = uVar38, bVar3)) {
                iVar7 = iVar20;
                uVar26 = uVar15;
                uVar38 = uVar15;
              }
              if (iVar24 < *(int *)(local_c8 + lVar9 * 4)) {
                iVar22 = *(int *)(local_48 + lVar9 * 4);
                iVar24 = *(int *)(local_c8 + lVar9 * 4);
              }
              if (iVar56 < *(int *)(local_98 + lVar9 * 4)) {
                iVar56 = *(int *)(local_98 + lVar9 * 4);
              }
            }
            if (s1_end == 0 || s2_end == 0) {
              iVar20 = s2Len + -1;
              if ((s1_end == 0) && (iVar7 = iVar56, uVar26 = uVar18, s2_end != 0)) {
                iVar7 = iVar24;
                iVar20 = iVar22;
              }
            }
            else if (iVar24 < iVar7) {
              iVar22 = s2Len + -1;
              iVar20 = iVar22;
            }
            else if ((iVar7 != iVar24) || (iVar20 = s2Len + -1, iVar22 != s2Len + -1)) {
              iVar7 = iVar24;
              uVar26 = uVar18;
              iVar20 = iVar22;
            }
            auVar30._0_4_ = -(uint)((int)local_158 < iVar23);
            auVar30._4_4_ = -(uint)((int)uStack_154 < iVar23);
            auVar30._8_4_ = -(uint)((int)uStack_150 < iVar23);
            auVar30._12_4_ = -(uint)((int)uStack_14c < iVar23);
            auVar46._0_4_ = -(uint)((int)uVar25 < (int)local_168._0_4_);
            auVar46._4_4_ = -(uint)((int)uVar25 < (int)local_168._4_4_);
            auVar46._8_4_ = -(uint)((int)uVar25 < (int)local_168._8_4_);
            auVar46._12_4_ = -(uint)((int)uVar25 < (int)local_168._12_4_);
            iVar23 = movmskps(iVar22,auVar46 | auVar30);
            if (iVar23 != 0) {
              *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
              iVar7 = 0;
              iVar20 = 0;
              uVar26 = 0;
            }
            ppVar8->score = iVar7;
            ppVar8->end_query = uVar26;
            ppVar8->end_ref = iVar20;
            local_88 = auVar6;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(ptr_02);
              return ppVar8;
            }
            return ppVar8;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar14 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_0061d547;
        __format = "%s: %s must be > 0\n";
        pcVar14 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_diag_sse41_128_32",pcVar14);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}